

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O1

int64_t duckdb::ParseInteger(Value *value,string *loption)

{
  pointer pcVar1;
  vector<duckdb::Value,_true> *this;
  int64_t iVar2;
  BinderException *pBVar3;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  while( true ) {
    if (value->is_null == true) {
      pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"\"%s\" expects a non-null integer value","");
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      pcVar1 = (loption->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar1,pcVar1 + loption->_M_string_length);
      BinderException::BinderException<std::__cxx11::string>(pBVar3,&local_88,&local_48);
      __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((value->type_).id_ != LIST) break;
    this = ListValue::GetChildren(value);
    if ((long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
              super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
              super__Vector_impl_data._M_start != 0x40) {
      pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"\"%s\" expects a single argument as an integer value","");
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      pcVar1 = (loption->_M_dataplus)._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar1,pcVar1 + loption->_M_string_length);
      BinderException::BinderException<std::__cxx11::string>(pBVar3,&local_88,&local_68);
      __cxa_throw(pBVar3,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    value = vector<duckdb::Value,_true>::operator[](this,0);
  }
  iVar2 = Value::GetValue<long>(value);
  return iVar2;
}

Assistant:

static int64_t ParseInteger(const Value &value, const string &loption) {
	if (value.IsNull()) {
		throw BinderException("\"%s\" expects a non-null integer value", loption);
	}
	if (value.type().id() == LogicalTypeId::LIST) {
		auto &children = ListValue::GetChildren(value);
		if (children.size() != 1) {
			// no option specified or multiple options specified
			throw BinderException("\"%s\" expects a single argument as an integer value", loption);
		}
		return ParseInteger(children[0], loption);
	}
	return value.GetValue<int64_t>();
}